

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O0

int32_t trng::int_math::modulo_helper<2147483647,_1>::modulo(uint64_t x)

{
  uint64_t y;
  uint64_t x_local;
  
  y = (x & 0x7fffffff) + (x >> 0x1f);
  if (0xfffffffd < y) {
    y = y - 0xfffffffe;
  }
  if (0x7ffffffe < y) {
    y = y - 0x7fffffff;
  }
  return (int32_t)y;
}

Assistant:

TRNG_CUDA_ENABLE
      static int32_t modulo(uint64_t x) {
        if (mask == m) {
          uint64_t y{(x & mask) + (x >> e)};
          if (y >= static_cast<uint64_t>(2u) * m)
            y -= static_cast<uint64_t>(2u) * m;
          if (y >= m)
            y -= m;
          return static_cast<int32_t>(y);
        }
        if (static_cast<int64_t>(k) * (static_cast<int64_t>(k) + 2) <= m) {
          x = (x & mask) + (x >> e) * k;
          x = (x & mask) + (x >> e) * k;
          if (x >= static_cast<uint64_t>(2u) * m)
            x -= static_cast<uint64_t>(2u) * m;
          if (x >= m)
            x -= m;
          return static_cast<int32_t>(x);
        }
        return static_cast<int32_t>(x % m);
      }